

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::doAddCol(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *objValue,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *lowerValue,
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *colVec,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *upperValue,bool scale)

{
  DataKey *pDVar1;
  uint *puVar2;
  pointer pnVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  undefined7 in_register_00000089;
  int iVar9;
  Item *pIVar10;
  cpp_dec_float<50U,_int,_void> *pcVar11;
  long lVar12;
  long in_FS_OFFSET;
  int idx;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  empty;
  int local_268;
  uint local_264;
  undefined4 local_260;
  int local_25c;
  Item *local_258;
  undefined8 uStack_250;
  long local_248;
  DataKey local_240;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_238;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  int local_1d0;
  undefined1 local_1cc;
  undefined8 local_1c8;
  undefined1 local_1b8 [8];
  DataKey DStack_1b0;
  uint local_1a8 [3];
  undefined3 uStack_19b;
  uint local_198;
  undefined3 uStack_193;
  int local_190;
  bool local_18c;
  undefined8 local_188;
  undefined **local_110;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  int local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  int local_80;
  undefined1 local_7c;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  local_260 = (undefined4)CONCAT71(in_register_00000089,scale);
  local_268 = (this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum;
  local_25c = (this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum;
  local_238.m_backend.data._M_elems._0_8_ =
       local_238.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
  local_1b8._0_4_ = 0;
  local_1b8._4_4_ = -1;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::add(&this->
         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ,(DataKey *)local_1b8,objValue,lowerValue,colVec,upperValue,(int *)&local_238);
  if (this->thesense != MAXIMIZE) {
    local_1b8._0_4_ = -1;
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
    ::operator*=((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                  *)((this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).object.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + local_268),(int *)local_1b8);
  }
  local_264 = 0;
  if ((char)local_260 != '\0') {
    local_264 = (*this->lp_scaler->_vptr_SPxScaler[1])
                          (this->lp_scaler,colVec,
                           &(this->
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).scaleExp);
    pcVar11 = &(this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_268].m_backend;
    ::soplex::infinity::__tls_init();
    local_258 = *(Item **)(in_FS_OFFSET + -8);
    local_188._0_4_ = cpp_dec_float_finite;
    local_188._4_4_ = 10;
    local_1b8._0_4_ = 0;
    local_1b8._4_4_ = 0;
    DStack_1b0.info = 0;
    DStack_1b0.idx = 0;
    local_1a8[0] = 0;
    local_1a8[1] = 0;
    stack0xfffffffffffffe60 = 0;
    uStack_19b = 0;
    _local_198 = 0;
    uStack_193 = 0;
    local_190 = 0;
    local_18c = false;
    uStack_250 = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)local_1b8,(double)local_258);
    if (((pcVar11->fpclass != cpp_dec_float_NaN) && ((fpclass_type)local_188 != cpp_dec_float_NaN))
       && (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (pcVar11,(cpp_dec_float<50U,_int,_void> *)local_1b8), iVar7 < 0)) {
      lVar8 = (long)local_268;
      pnVar3 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_68 = *(undefined8 *)&pnVar3[lVar8].m_backend.data;
      uStack_60 = *(undefined8 *)(pnVar3[lVar8].m_backend.data._M_elems + 2);
      puVar2 = pnVar3[lVar8].m_backend.data._M_elems + 4;
      local_58 = *(undefined8 *)puVar2;
      uStack_50 = *(undefined8 *)(puVar2 + 2);
      local_48 = *(undefined8 *)(pnVar3[lVar8].m_backend.data._M_elems + 8);
      local_40 = pnVar3[lVar8].m_backend.exp;
      local_3c = pnVar3[lVar8].m_backend.neg;
      local_38._0_4_ = pnVar3[lVar8].m_backend.fpclass;
      local_38._4_4_ = pnVar3[lVar8].m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)local_1b8,(soplex *)&local_68,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)-local_264,(int)pnVar3);
      lVar8 = (long)local_268;
      pnVar3 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)(pnVar3[lVar8].m_backend.data._M_elems + 8) = CONCAT35(uStack_193,_local_198);
      puVar2 = pnVar3[lVar8].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = local_1a8._0_8_;
      *(ulong *)(puVar2 + 2) = CONCAT35(uStack_19b,stack0xfffffffffffffe60);
      pDVar1 = (DataKey *)(pnVar3 + lVar8);
      pDVar1->info = local_1b8._0_4_;
      pDVar1->idx = local_1b8._4_4_;
      pDVar1[1] = DStack_1b0;
      pnVar3[lVar8].m_backend.exp = local_190;
      pnVar3[lVar8].m_backend.neg = local_18c;
      pnVar3[lVar8].m_backend.fpclass = (fpclass_type)local_188;
      pnVar3[lVar8].m_backend.prec_elem = local_188._4_4_;
    }
    pcVar11 = &(this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_268].m_backend;
    ::soplex::infinity::__tls_init();
    local_188._0_4_ = cpp_dec_float_finite;
    local_188._4_4_ = 10;
    local_1b8._0_4_ = 0;
    local_1b8._4_4_ = 0;
    DStack_1b0.info = 0;
    DStack_1b0.idx = 0;
    local_1a8[0] = 0;
    local_1a8[1] = 0;
    stack0xfffffffffffffe60 = 0;
    uStack_19b = 0;
    _local_198 = 0;
    uStack_193 = 0;
    local_190 = 0;
    local_18c = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)local_1b8,-(double)local_258);
    if (((pcVar11->fpclass != cpp_dec_float_NaN) && ((fpclass_type)local_188 != cpp_dec_float_NaN))
       && (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (pcVar11,(cpp_dec_float<50U,_int,_void> *)local_1b8), 0 < iVar7)) {
      lVar8 = (long)local_268;
      pnVar3 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_a8 = *(undefined8 *)&pnVar3[lVar8].m_backend.data;
      uStack_a0 = *(undefined8 *)(pnVar3[lVar8].m_backend.data._M_elems + 2);
      puVar2 = pnVar3[lVar8].m_backend.data._M_elems + 4;
      local_98 = *(undefined8 *)puVar2;
      uStack_90 = *(undefined8 *)(puVar2 + 2);
      local_88 = *(undefined8 *)(pnVar3[lVar8].m_backend.data._M_elems + 8);
      local_80 = pnVar3[lVar8].m_backend.exp;
      local_7c = pnVar3[lVar8].m_backend.neg;
      local_78._0_4_ = pnVar3[lVar8].m_backend.fpclass;
      local_78._4_4_ = pnVar3[lVar8].m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)local_1b8,(soplex *)&local_a8,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)-local_264,(int)pnVar3);
      lVar8 = (long)local_268;
      pnVar3 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)(pnVar3[lVar8].m_backend.data._M_elems + 8) = CONCAT35(uStack_193,_local_198);
      puVar2 = pnVar3[lVar8].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = local_1a8._0_8_;
      *(ulong *)(puVar2 + 2) = CONCAT35(uStack_19b,stack0xfffffffffffffe60);
      pDVar1 = (DataKey *)(pnVar3 + lVar8);
      pDVar1->info = local_1b8._0_4_;
      pDVar1->idx = local_1b8._4_4_;
      pDVar1[1] = DStack_1b0;
      pnVar3[lVar8].m_backend.exp = local_190;
      pnVar3[lVar8].m_backend.neg = local_18c;
      pnVar3[lVar8].m_backend.fpclass = (fpclass_type)local_188;
      pnVar3[lVar8].m_backend.prec_elem = local_188._4_4_;
    }
    uVar6 = local_264;
    lVar8 = (long)local_268;
    pnVar3 = (this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_e8 = *(undefined8 *)&pnVar3[lVar8].m_backend.data;
    uStack_e0 = *(undefined8 *)(pnVar3[lVar8].m_backend.data._M_elems + 2);
    puVar2 = pnVar3[lVar8].m_backend.data._M_elems + 4;
    local_d8 = *(undefined8 *)puVar2;
    uStack_d0 = *(undefined8 *)(puVar2 + 2);
    local_c8 = *(undefined8 *)(pnVar3[lVar8].m_backend.data._M_elems + 8);
    local_c0 = pnVar3[lVar8].m_backend.exp;
    local_bc = pnVar3[lVar8].m_backend.neg;
    local_b8._0_4_ = pnVar3[lVar8].m_backend.fpclass;
    local_b8._4_4_ = pnVar3[lVar8].m_backend.prec_elem;
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)local_1b8,(soplex *)&local_e8,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(ulong)local_264,(int)pnVar3);
    lVar8 = (long)local_268;
    pnVar3 = (this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(ulong *)(pnVar3[lVar8].m_backend.data._M_elems + 8) = CONCAT35(uStack_193,_local_198);
    puVar2 = pnVar3[lVar8].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = local_1a8._0_8_;
    *(ulong *)(puVar2 + 2) = CONCAT35(uStack_19b,stack0xfffffffffffffe60);
    pDVar1 = (DataKey *)(pnVar3 + lVar8);
    pDVar1->info = local_1b8._0_4_;
    pDVar1->idx = local_1b8._4_4_;
    pDVar1[1] = DStack_1b0;
    pnVar3[lVar8].m_backend.exp = local_190;
    pnVar3[lVar8].m_backend.neg = local_18c;
    pnVar3[lVar8].m_backend.fpclass = (fpclass_type)local_188;
    pnVar3[lVar8].m_backend.prec_elem = local_188._4_4_;
    (this->
    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).scaleExp.data[local_268] = uVar6;
  }
  pIVar10 = (this->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.theitem;
  iVar7 = (this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thekey[local_268].idx;
  lVar8 = (long)pIVar10[iVar7].data.
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused;
  if (0 < lVar8) {
    pIVar10 = pIVar10 + iVar7;
    local_258 = pIVar10;
    do {
      lVar12 = lVar8 + -1;
      iVar7 = (pIVar10->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .m_elem[lVar8 + -1].idx;
      if ((char)local_260 != '\0') {
        pNVar4 = (pIVar10->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        local_1d8 = *(undefined8 *)(pNVar4[lVar12].val.m_backend.data._M_elems + 8);
        local_1f8 = *(undefined8 *)&pNVar4[lVar12].val.m_backend.data;
        uStack_1f0 = *(undefined8 *)(pNVar4[lVar12].val.m_backend.data._M_elems + 2);
        puVar2 = pNVar4[lVar12].val.m_backend.data._M_elems + 4;
        local_1e8 = *(undefined8 *)puVar2;
        uStack_1e0 = *(undefined8 *)(puVar2 + 2);
        local_1d0 = pNVar4[lVar12].val.m_backend.exp;
        local_1cc = pNVar4[lVar12].val.m_backend.neg;
        local_1c8._0_4_ = pNVar4[lVar12].val.m_backend.fpclass;
        local_1c8._4_4_ = pNVar4[lVar12].val.m_backend.prec_elem;
        spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)local_1b8,(soplex *)&local_1f8,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(ulong)((this->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).scaleExp.data[iVar7] + local_264),
                   CONCAT31((int3)((uint)local_1d0 >> 8),local_1cc));
        pNVar4 = (local_258->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        *(ulong *)(pNVar4[lVar12].val.m_backend.data._M_elems + 8) = CONCAT35(uStack_193,_local_198)
        ;
        puVar2 = pNVar4[lVar12].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = local_1a8._0_8_;
        *(ulong *)(puVar2 + 2) = CONCAT35(uStack_19b,stack0xfffffffffffffe60);
        *(undefined1 (*) [8])&pNVar4[lVar12].val.m_backend.data = local_1b8;
        *(DataKey *)(pNVar4[lVar12].val.m_backend.data._M_elems + 2) = DStack_1b0;
        pNVar4[lVar12].val.m_backend.exp = local_190;
        pNVar4[lVar12].val.m_backend.neg = local_18c;
        pNVar4[lVar12].val.m_backend.fpclass = (fpclass_type)local_188;
        pNVar4[lVar12].val.m_backend.prec_elem = local_188._4_4_;
        pIVar10 = local_258;
      }
      pNVar4 = (pIVar10->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      local_238.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pNVar4[lVar12].val.m_backend.data._M_elems + 8);
      local_238.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pNVar4[lVar12].val.m_backend.data;
      local_238.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pNVar4[lVar12].val.m_backend.data._M_elems + 2);
      puVar2 = pNVar4[lVar12].val.m_backend.data._M_elems + 4;
      local_238.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_238.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      local_238.m_backend.exp = pNVar4[lVar12].val.m_backend.exp;
      local_238.m_backend.neg = pNVar4[lVar12].val.m_backend.neg;
      local_238.m_backend.fpclass = pNVar4[lVar12].val.m_backend.fpclass;
      local_238.m_backend.prec_elem = pNVar4[lVar12].val.m_backend.prec_elem;
      if ((this->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum <= iVar7) {
        local_248 = lVar12;
        LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::LPRowBase((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)local_1b8,0);
        iVar9 = (this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum;
        if (iVar9 <= iVar7) {
          iVar9 = (iVar7 - iVar9) + 1;
          do {
            local_240.info = 0;
            local_240.idx = -1;
            LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add(&this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,&local_240,
                  (LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)local_1b8);
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
        local_110 = &PTR__DSVectorBase_006adc40;
        pIVar10 = local_258;
        lVar12 = local_248;
        if (local_f8 !=
            (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0) {
          free(local_f8);
          local_f8 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0x0;
          pIVar10 = local_258;
          lVar12 = local_248;
        }
      }
      LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add2(&this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ,iVar7,1,&local_268,&local_238);
      bVar5 = 1 < lVar8;
      lVar8 = lVar12;
    } while (bVar5);
  }
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x51])(this,1);
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x50])
            (this,(ulong)(uint)((this->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .set.thenum - local_25c));
  return;
}

Assistant:

void doAddCol(const R& objValue, const R& lowerValue, const SVectorBase<R>& colVec,
                 const R& upperValue, bool scale = false)
   {
      int idx = nCols();
      int oldRowNumber = nRows();
      int newColScaleExp = 0;

      LPColSetBase<R>::add(objValue, lowerValue, colVec, upperValue);

      if(thesense != MAXIMIZE)
         LPColSetBase<R>::maxObj_w(idx) *= -1;

      DataArray <int>& rowscaleExp = LPRowSetBase<R>::scaleExp;

      // compute new column scaling factor and apply it to the bounds
      if(scale)
      {
         newColScaleExp = lp_scaler->computeScaleExp(colVec, rowscaleExp);

         if(upper(idx) < R(infinity))
            upper_w(idx) = spxLdexp(upper_w(idx), - newColScaleExp);

         if(lower(idx) > R(-infinity))
            lower_w(idx) = spxLdexp(lower_w(idx), - newColScaleExp);

         maxObj_w(idx) = spxLdexp(maxObj_w(idx), newColScaleExp);

         LPColSetBase<R>::scaleExp[idx] = newColScaleExp;
      }

      SVectorBase<R>& vec = colVector_w(idx);

      // now insert nonzeros to row file also
      for(int j = vec.size() - 1; j >= 0; --j)
      {
         int i = vec.index(j);

         if(scale)
            vec.value(j) = spxLdexp(vec.value(j), newColScaleExp + rowscaleExp[i]);

         R val = vec.value(j);

         // create new rows if required
         if(i >= nRows())
         {
            LPRowBase<R> empty;

            for(int k = nRows(); k <= i; ++k)
               LPRowSetBase<R>::add(empty);
         }

         assert(i < nRows());
         LPRowSetBase<R>::add2(i, 1, &idx, &val);
      }

      addedCols(1);
      addedRows(nRows() - oldRowNumber);
   }